

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarLocation.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
license::locate::EnvironmentVarLocation::license_locations_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,EnvironmentVarLocation *this,EventRegistry *eventRegistry)

{
  char *pcVar1;
  allocator local_69;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  declared_positions;
  string varName;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&varName,"LICENSE_LOCATION",(allocator *)&local_68);
  if (varName._M_string_length != 0) {
    pcVar1 = getenv("LICENSE_LOCATION");
    if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
      EventRegistry::addEvent
                (eventRegistry,ENVIRONMENT_VARIABLE_NOT_DEFINED,(char *)0x0,(char *)0x0);
    }
    else {
      std::__cxx11::string::string((string *)&local_68,pcVar1,&local_69);
      split_string(&declared_positions,&local_68,';');
      std::__cxx11::string::~string((string *)&local_68);
      filter_existing_files
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_68,&declared_positions,eventRegistry,"LICENSE_LOCATION");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(__return_storage_ptr__,&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&declared_positions);
    }
  }
  std::__cxx11::string::~string((string *)&varName);
  return __return_storage_ptr__;
}

Assistant:

const vector<string> EnvironmentVarLocation::license_locations(EventRegistry &eventRegistry) {
	vector<string> licenseFileFoundWithEnvVariable;

	const string varName(LCC_LICENSE_LOCATION_ENV_VAR);
	if (varName.length() > 0) {
		// var name is defined in header files.
		char *env_var_value = getenv(LCC_LICENSE_LOCATION_ENV_VAR);
		if (env_var_value != nullptr && env_var_value[0] != '\0') {
			const vector<string> declared_positions = license::split_string(string(env_var_value), ';');
			licenseFileFoundWithEnvVariable =
				license::filter_existing_files(declared_positions, eventRegistry, LCC_LICENSE_LOCATION_ENV_VAR);
		} else {
			eventRegistry.addEvent(ENVIRONMENT_VARIABLE_NOT_DEFINED);
		}
	}
	return licenseFileFoundWithEnvVariable;
}